

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O1

DataFieldInfo * __thiscall ser::FieldsTable::Find(FieldsTable *this,string *fieldName)

{
  iterator iVar1;
  long *plVar2;
  SerializationException *this_00;
  string msg;
  SerializationException exception;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  undefined1 local_30 [24];
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
                  *)this,fieldName);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
    return (DataFieldInfo *)(iVar1._M_node + 2);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 "Error: field ",fieldName);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_40);
  *plVar2 = (long)(plVar2 + 2);
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_40 != (undefined1  [8])local_30) {
    operator_delete((void *)local_40);
  }
  local_40 = (undefined1  [8])&PTR__SerializationException_001388a8;
  local_38._M_p = local_30 + 8;
  local_30._0_8_ = 0;
  local_30[8] = '\0';
  std::__cxx11::string::_M_assign((string *)&local_38);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)local_40);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

DataFieldInfo& FieldsTable::Find(const std::string& fieldName)
{
    const std::map<std::string, DataFieldInfo>::iterator iter = data_.find(fieldName);

    if (iter == data_.end())
    {
        // Field does not exist
        std::string msg = "Error: field " + fieldName + " is not registered\n";
        SerializationException exception;
        exception.Init(msg);
        throw exception;
    }

    return iter->second;
}